

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O1

void __thiscall
CNNTest_TestSoftsignSingleLayer_Test::TestBody(CNNTest_TestSoftsignSingleLayer_Test *this)

{
  long lVar1;
  undefined8 *puVar2;
  float *pfVar3;
  byte bVar4;
  float bias [1];
  CNN_THREAD_DATA thread_data;
  float expected_valid [20];
  float weights [20];
  float expected_replicate [64];
  float expected_same [64];
  float input [64];
  float local_227c;
  CNN_THREAD_DATA local_2278;
  float local_2268 [20];
  float local_2218 [20];
  float local_21c8 [64];
  float local_20c8 [64];
  float local_1fc8 [66];
  CNN_CONFIG local_1ec0;
  
  bVar4 = 0;
  memcpy(local_1fc8,&DAT_00c45700,0x100);
  memcpy(local_20c8,&DAT_00c45800,0x100);
  memcpy(local_21c8,&DAT_00c45900,0x100);
  puVar2 = &DAT_00c45a00;
  pfVar3 = local_2268;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pfVar3 = pfVar3 + ((ulong)bVar4 * -2 + 1) * 2;
  }
  puVar2 = &DAT_00c45a50;
  pfVar3 = local_2218;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pfVar3 = pfVar3 + (ulong)bVar4 * -4 + 2;
  }
  local_227c = 0.75;
  memset(&local_1ec0,0,0x1e90);
  local_1ec0.num_layers = 1;
  local_1ec0.layer_config[0].in_channels = 1;
  local_1ec0.layer_config[0].filter_width = 4;
  local_1ec0.layer_config[0].filter_height = 5;
  local_1ec0.layer_config[0].out_channels = 1;
  local_1ec0.layer_config[0].skip_width = 1;
  local_1ec0.layer_config[0].skip_height = 1;
  local_1ec0.layer_config[0].pad = '\0';
  local_1ec0.layer_config[0].activation = '\x02';
  local_1ec0.layer_config[0].branch_copy_type = '\0';
  local_1ec0.layer_config[0].branch_combine_type = '\0';
  local_2278.num_workers = 1;
  local_2278._4_4_ = 0;
  local_2278.workers = (AVxWorker *)0x0;
  local_1ec0.layer_config[0].weights = local_2218;
  local_1ec0.layer_config[0].bias = &local_227c;
  anon_unknown.dwarf_69847d::CNNTest::RunCNNTest
            (8,8,local_1fc8,local_20c8,&local_1ec0,8,&local_2278,1e-06);
  local_1ec0.layer_config[0].pad = '\x01';
  anon_unknown.dwarf_69847d::CNNTest::RunCNNTest
            (8,8,local_1fc8,local_21c8,&local_1ec0,8,&local_2278,1e-06);
  local_1ec0.layer_config[0].pad = '\x02';
  anon_unknown.dwarf_69847d::CNNTest::RunCNNTest
            (8,8,local_1fc8,local_2268,&local_1ec0,8,&local_2278,1e-06);
  return;
}

Assistant:

TEST_F(CNNTest, TestSoftsignSingleLayer) {
  int image_width = 8;
  int image_height = 8;
  int filter_height = 5;
  int filter_width = 4;
  float input[] = {
    -0.5220f, 0.8410f,  -0.8990f, -0.0090f, 0.6710f,  -0.9470f, -0.8240f,
    -0.0870f, 0.5380f,  0.4750f,  0.570f,   -0.3760f, -0.6960f, -0.5940f,
    -0.3830f, 0.080f,   -0.0980f, -0.4940f, -0.4030f, 0.9460f,  -0.6020f,
    0.4220f,  0.6190f,  0.6640f,  -0.9210f, -0.1470f, -0.2480f, -0.1120f,
    -0.580f,  -0.0650f, 0.3330f,  0.9860f,  -0.7430f, 0.7610f,  0.4840f,
    0.1030f,  0.9570f,  0.6120f,  -0.5240f, -0.1220f, -0.5850f, -0.270f,
    0.7840f,  -0.9790f, 0.7290f,  -0.30f,   -0.6460f, 0.0780f,  0.4750f,
    -0.0510f, 0.4550f,  0.3850f,  -0.7230f, 0.4460f,  -0.6260f, -0.810f,
    0.8720f,  -0.2120f, -0.580f,  -0.9510f, -0.8430f, -0.1340f, -0.0850f,
    0.9190f,
  };
  float expected_same[] = {
    0.430f,   0.660f,  0.5510f,  -0.610f,  0.450f,  -0.1610f, 0.0520f,  0.3240f,
    0.6820f,  0.3820f, 0.6360f,  0.7480f,  0.3080f, 0.090f,   0.3910f,  0.1730f,
    0.340f,   0.6660f, -0.4990f, 0.4280f,  0.1540f, 0.120f,   0.4670f,  0.6150f,
    -0.3880f, 0.7590f, 0.4190f,  0.7350f,  0.5310f, -0.5160f, -0.1760f, 0.6790f,
    -0.6780f, 0.5470f, 0.5750f,  -0.6420f, 0.7210f, -0.4620f, 0.5430f,  0.770f,
    -0.1990f, 0.3950f, 0.7860f,  -0.4380f, 0.7540f, 0.2640f,  -0.6430f, 0.4510f,
    -0.1260f, 0.1590f, -0.2110f, -0.0560f, 0.6570f, 0.680f,   0.5870f,  0.4720f,
    0.4040f,  0.3630f, 0.670f,   0.2360f,  0.410f,  0.6980f,  -0.5350f, 0.3940f,
  };
  float expected_replicate[] = {
    0.540f,   0.7230f,  -0.3530f, -0.2130f, 0.7440f,  -0.4470f, -0.6260f,
    -0.2050f, 0.7230f,  0.4630f,  0.5920f,  0.7440f,  0.6080f,  0.3130f,
    -0.5670f, -0.4720f, 0.5480f,  0.6660f,  -0.4990f, 0.4280f,  0.1540f,
    0.120f,   0.3390f,  0.6090f,  0.4160f,  0.7590f,  0.4190f,  0.7350f,
    0.5310f,  -0.5160f, -0.490f,  0.4450f,  -0.610f,  0.5470f,  0.5750f,
    -0.6420f, 0.7210f,  -0.4620f, 0.3150f,  0.7370f,  -0.5820f, 0.3950f,
    0.7860f,  -0.4380f, 0.7540f,  0.2640f,  -0.7430f, -0.5340f, -0.6270f,
    0.4430f,  0.4730f,  0.4570f,  0.7450f,  0.630f,   0.2620f,  0.3140f,
    -0.1840f, 0.1810f,  0.7210f,  0.2760f,  0.6430f,  0.6720f,  -0.4390f,
    0.2040f,
  };
  float expected_valid[] = {
    0.6660f,  -0.4990f, 0.4280f,  0.1540f,  0.120f,  0.7590f,  0.4190f,
    0.7350f,  0.5310f,  -0.5160f, 0.5470f,  0.5750f, -0.6420f, 0.7210f,
    -0.4620f, 0.3950f,  0.7860f,  -0.4380f, 0.7540f, 0.2640f,
  };
  float weights[] = {
    0.6210f,  0.3710f,  -0.2770f, -0.7230f, -0.2450f, 0.6770f,  0.3080f,
    -0.9880f, -0.080f,  0.7190f,  -0.6760f, -0.0170f, -0.8970f, 0.8260f,
    0.7390f,  -0.4550f, -0.4260f, -0.6330f, 0.0880f,  -0.9390f,
  };
  float bias[] = {
    0.750f,
  };

  CNN_CONFIG cnn_config = { 1,
                            0,
                            0,
                            0,
                            0,
                            { {
                                1,
                                filter_width,
                                filter_height,
                                1,
                                1,
                                1,
                                0,
                                weights,
                                bias,
                                PADDING_SAME_ZERO,
                                SOFTSIGN,
                                0,
                                0,
                                BRANCH_NO_COPY,
                                BRANCH_NOC,
                                {},
                                {},
                                0,
                            } } };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected_same, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  cnn_config.layer_config[0].pad = PADDING_SAME_REPLICATE;

  RunCNNTest(image_width, image_height, input, expected_replicate, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  cnn_config.layer_config[0].pad = PADDING_VALID;

  RunCNNTest(image_width, image_height, input, expected_valid, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);
}